

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_tree_make_filtration_non_decreasing_unit_test.cpp
# Opt level: O0

void __thiscall
make_filtration_non_decreasing_on_nan_values<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>
::test_method(make_filtration_non_decreasing_on_nan_values<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>
              *this)

{
  undefined8 uVar1;
  type_conflict2 tVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  lazy_ostream *plVar6;
  reference piVar7;
  Filtration_value *pFVar8;
  basic_cstring<const_char> local_498;
  basic_cstring<const_char> local_488;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_478;
  iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
  local_458;
  assertion_result local_450;
  basic_cstring<const_char> local_438;
  basic_cstring<const_char> local_428;
  iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
  local_418;
  iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
  f_simplex_1;
  Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>
  __end0_1;
  Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>
  __begin0_1;
  Complex_simplex_range *__range1_1;
  basic_cstring<const_char> local_398;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_388;
  assertion_result local_368;
  basic_cstring<const_char> local_350;
  basic_cstring<const_char> local_340;
  Filtration_value local_330;
  undefined4 local_324;
  undefined4 *local_320;
  undefined8 local_318;
  undefined1 local_310 [48];
  __node_base_ptr local_2e0;
  undefined1 local_2d4 [28];
  node_ptr local_2b8;
  undefined1 local_2ac [20];
  undefined1 local_298 [48];
  __node_base_ptr local_268;
  Simplex_tree_siblings<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>,_boost::container::map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>,_std::less<int>,_void,_void>_>
  local_25c;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_220;
  iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
  local_200;
  assertion_result local_1f8;
  basic_cstring<const_char> local_1e0;
  basic_cstring<const_char> local_1d0;
  iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
  local_1c0;
  iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
  f_simplex;
  Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>
  __end0;
  Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>
  __begin0;
  Complex_simplex_range *__range1;
  __node_base local_140;
  undefined4 local_134;
  float local_130;
  undefined4 local_12c;
  undefined4 *local_128;
  __node_base_ptr local_120;
  undefined1 local_118 [28];
  undefined4 local_fc;
  node_ptr local_f8;
  node_ptr local_f0;
  undefined1 local_d8 [32];
  float local_b8;
  undefined4 local_b4;
  node_ptr local_b0;
  __node_base_ptr local_a8;
  undefined1 local_a0 [8];
  Simplex_tree<Simplex_tree_options_stable_simplex_handles> st;
  make_filtration_non_decreasing_on_nan_values<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>
  *this_local;
  
  st._136_8_ = this;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::Simplex_tree
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_a0);
  local_d8._28_4_ = 2;
  local_b8 = 1.4013e-45;
  local_b4 = 0;
  local_b0 = (node_ptr)(local_d8 + 0x1c);
  local_a8 = (__node_base_ptr)0x3;
  local_d8._16_8_ = std::numeric_limits<double>::quiet_NaN();
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_d8,
             (initializer_list<int> *)local_a0,(Filtration_value *)&local_b0);
  local_118._24_4_ = 3;
  local_fc = 0;
  local_f8 = (node_ptr)(local_118 + 0x18);
  local_f0 = (node_ptr)0x2;
  local_118._16_8_ = std::numeric_limits<double>::quiet_NaN();
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_118,
             (initializer_list<int> *)local_a0,(Filtration_value *)&local_f8);
  local_134 = 3;
  local_130 = 5.60519e-45;
  local_12c = 5;
  local_128 = &local_134;
  local_120 = (__node_base_ptr)0x3;
  local_140._M_nxt = (_Hash_node_base *)std::numeric_limits<double>::quiet_NaN();
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)&__range1,
             (initializer_list<int> *)local_a0,(Filtration_value *)&local_128);
  poVar5 = std::operator<<((ostream *)&std::clog,"SPECIFIC CASE:");
  std::ostream::operator<<((ostream *)poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::clog,
                           "Insertion with NaN values does not ensure the filtration values are non decreasing"
                          );
  std::ostream::operator<<((ostream *)poVar5,std::endl<char,std::char_traits<char>>);
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::make_filtration_non_decreasing
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_a0);
  poVar5 = std::operator<<((ostream *)&std::clog,"Check all filtration values are NaN");
  std::ostream::operator<<((ostream *)poVar5,std::endl<char,std::char_traits<char>>);
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::complex_simplex_range
            ((Complex_simplex_range *)&__begin0.st_,
             (Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_a0);
  boost::iterator_range_detail::
  iterator_range_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>,_boost::iterators::incrementable_traversal_tag>
  ::begin((Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>
           *)&__end0.st_,
          (iterator_range_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>,_boost::iterators::incrementable_traversal_tag>
           *)&__begin0.st_);
  boost::iterator_range_detail::
  iterator_range_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>,_boost::iterators::incrementable_traversal_tag>
  ::end((Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>
         *)&f_simplex,
        (iterator_range_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>,_boost::iterators::incrementable_traversal_tag>
         *)&__begin0.st_);
  while( true ) {
    tVar2 = boost::iterators::operator!=
                      ((iterator_facade<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>,_const_boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>_&,_long>
                        *)&__end0.st_,
                       (iterator_facade<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>,_const_boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>_&,_long>
                        *)&f_simplex);
    if (!tVar2) break;
    piVar7 = boost::iterators::detail::
             iterator_facade_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>,_const_boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>_&,_long,_false,_false>
             ::operator*((iterator_facade_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>,_const_boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>_&,_long,_false,_false>
                          *)&__end0.st_);
    boost::container::dtl::
    iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
    ::iterator_from_iiterator(&local_1c0,piVar7);
    do {
      uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_1d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_make_filtration_non_decreasing_unit_test.cpp"
                 ,0x95);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1e0);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1d0,0x92,&local_1e0);
      boost::container::dtl::
      iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
      ::iterator_from_iiterator(&local_200,&local_1c0);
      pFVar8 = Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::filtration
                         (&local_200);
      iVar4 = std::isnan(*pFVar8);
      boost::test_tools::assertion_result::assertion_result(&local_1f8,SUB41(iVar4,0));
      plVar6 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 ((long)&local_25c.members_.
                         super_tree<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_int,_std::less<int>,_void,_void>
                         .
                         super_node_alloc_holder<boost::container::new_allocator<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
                         .m_icont.
                         super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
                         .
                         super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                         .
                         super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                         .
                         super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
                         .
                         super_bstbase3<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
                         .holder.root.super_node.right_ + 4),"std::isnan(st.filtration(f_simplex))",
                 0x24);
      boost::unit_test::operator<<
                (&local_220,plVar6,
                 (basic_cstring<const_char> *)
                 ((long)&local_25c.members_.
                         super_tree<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_int,_std::less<int>,_void,_void>
                         .
                         super_node_alloc_holder<boost::container::new_allocator<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
                         .m_icont.
                         super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
                         .
                         super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                         .
                         super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                         .
                         super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
                         .
                         super_bstbase3<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
                         .holder.root.super_node.right_ + 4));
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)((long)&local_25c + 0x1c),
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_make_filtration_non_decreasing_unit_test.cpp"
                 ,0x95);
      boost::test_tools::tt_detail::report_assertion
                (&local_1f8,&local_220,(long)&local_25c + 0x1c,0x92,1,0,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(&local_220);
      boost::test_tools::assertion_result::~assertion_result(&local_1f8);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    boost::iterators::detail::
    iterator_facade_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>,_const_boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>_&,_long,_false,_false>
    ::operator++((iterator_facade_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>,_const_boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>_&,_long,_false,_false>
                  *)&__end0.st_);
  }
  local_25c.oncles_._0_4_ = 0;
  local_25c._4_8_ = (long)local_298 + 0x3c;
  local_25c._12_8_ = 1;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::find<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)((long)&local_25c + 0x14),
             (initializer_list<int> *)local_a0);
  local_268 = (__node_base_ptr)0x0;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::assign_filtration
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_a0,
             (Simplex_handle *)((long)&local_25c + 0x14),
             (Filtration_value *)((long)local_298 + 0x30));
  local_298._20_4_ = 1;
  local_298._24_8_ = local_298 + 0x14;
  local_298._32_8_ = 1;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::find<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)(local_298 + 0x28),
             (initializer_list<int> *)local_a0);
  local_298._8_8_ = (pointer)0x0;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::assign_filtration
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_a0,
             (Simplex_handle *)(local_298 + 0x28),(Filtration_value *)(local_298 + 8));
  local_2ac._0_4_ = 2;
  local_2ac._4_8_ = local_2ac;
  local_2ac._12_8_ = (pointer)0x1;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::find<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_298,
             (initializer_list<int> *)local_a0);
  local_2b8 = (node_ptr)0x0;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::assign_filtration
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_a0,
             (Simplex_handle *)local_298,(Filtration_value *)&local_2b8);
  local_2d4._0_4_ = 3;
  local_2d4._4_8_ = local_2d4;
  local_2d4._12_8_ = 1;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::find<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)(local_2d4 + 0x14),
             (initializer_list<int> *)local_a0);
  local_2e0 = (__node_base_ptr)0x0;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::assign_filtration
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_a0,
             (Simplex_handle *)(local_2d4 + 0x14),(Filtration_value *)&local_2e0);
  local_310._20_4_ = 4;
  local_310._24_8_ = local_310 + 0x14;
  local_310._32_8_ = 1;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::find<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)(local_310 + 0x28),
             (initializer_list<int> *)local_a0);
  local_310._8_8_ = 0;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::assign_filtration
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_a0,
             (Simplex_handle *)(local_310 + 0x28),(Filtration_value *)(local_310 + 8));
  local_324 = 5;
  local_320 = &local_324;
  local_318 = 1;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::find<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_310,
             (initializer_list<int> *)local_a0);
  local_330 = 0.0;
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::assign_filtration
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_a0,
             (Simplex_handle *)local_310,&local_330);
  poVar5 = std::operator<<((ostream *)&std::clog,
                           "Check make_filtration_non_decreasing is modifying the simplicial complex"
                          );
  std::ostream::operator<<((ostream *)poVar5,std::endl<char,std::char_traits<char>>);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_340,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_make_filtration_non_decreasing_unit_test.cpp"
               ,0x95);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_350);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_340,0x9d,&local_350);
    bVar3 = Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::
            make_filtration_non_decreasing
                      ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_a0);
    boost::test_tools::assertion_result::assertion_result(&local_368,bVar3);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_398,"st.make_filtration_non_decreasing()",0x23);
    boost::unit_test::operator<<(&local_388,plVar6,&local_398);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&__range1_1,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_make_filtration_non_decreasing_unit_test.cpp"
               ,0x95);
    boost::test_tools::tt_detail::report_assertion(&local_368,&local_388,&__range1_1,0x9d,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_388);
    boost::test_tools::assertion_result::~assertion_result(&local_368);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  poVar5 = std::operator<<((ostream *)&std::clog,"Check all filtration values are now defined");
  std::ostream::operator<<((ostream *)poVar5,std::endl<char,std::char_traits<char>>);
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::complex_simplex_range
            ((Complex_simplex_range *)&__begin0_1.st_,
             (Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_a0);
  boost::iterator_range_detail::
  iterator_range_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>,_boost::iterators::incrementable_traversal_tag>
  ::begin((Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>
           *)&__end0_1.st_,
          (iterator_range_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>,_boost::iterators::incrementable_traversal_tag>
           *)&__begin0_1.st_);
  boost::iterator_range_detail::
  iterator_range_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>,_boost::iterators::incrementable_traversal_tag>
  ::end((Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>
         *)&f_simplex_1,
        (iterator_range_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>,_boost::iterators::incrementable_traversal_tag>
         *)&__begin0_1.st_);
  while( true ) {
    tVar2 = boost::iterators::operator!=
                      ((iterator_facade<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>,_const_boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>_&,_long>
                        *)&__end0_1.st_,
                       (iterator_facade<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>,_const_boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>_&,_long>
                        *)&f_simplex_1);
    if (!tVar2) break;
    piVar7 = boost::iterators::detail::
             iterator_facade_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>,_const_boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>_&,_long,_false,_false>
             ::operator*((iterator_facade_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>,_const_boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>_&,_long,_false,_false>
                          *)&__end0_1.st_);
    boost::container::dtl::
    iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
    ::iterator_from_iiterator(&local_418,piVar7);
    do {
      uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_428,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_make_filtration_non_decreasing_unit_test.cpp"
                 ,0x95);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_438);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_428,0xa1,&local_438);
      boost::container::dtl::
      iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
      ::iterator_from_iiterator(&local_458,&local_418);
      pFVar8 = Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::filtration
                         (&local_458);
      iVar4 = std::isnan(*pFVar8);
      boost::test_tools::assertion_result::assertion_result(&local_450,(bool)((byte)iVar4 ^ 1));
      plVar6 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_488,"!std::isnan(st.filtration(f_simplex))",0x25);
      boost::unit_test::operator<<(&local_478,plVar6,&local_488);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_498,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_make_filtration_non_decreasing_unit_test.cpp"
                 ,0x95);
      boost::test_tools::tt_detail::report_assertion(&local_450,&local_478,&local_498,0xa1,1,0,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(&local_478);
      boost::test_tools::assertion_result::~assertion_result(&local_450);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    boost::iterators::detail::
    iterator_facade_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>,_const_boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>_&,_long,_false,_false>
    ::operator++((iterator_facade_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>,_const_boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>_&,_long,_false,_false>
                  *)&__end0_1.st_);
  }
  Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::~Simplex_tree
            ((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_a0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(make_filtration_non_decreasing_on_nan_values, typeST, list_of_tested_variants) {
  typeST st;

  st.insert_simplex_and_subfaces({2, 1, 0}, std::numeric_limits<double>::quiet_NaN());
  st.insert_simplex_and_subfaces({3, 0},    std::numeric_limits<double>::quiet_NaN());
  st.insert_simplex_and_subfaces({3, 4, 5}, std::numeric_limits<double>::quiet_NaN());
  
  /* Inserted simplex:     */
  /*    1                  */
  /*    o                  */
  /*   /X\                 */
  /*  o---o---o---o        */
  /*  2   0   3\X/4        */
  /*            o          */
  /*            5          */

  std::clog << "SPECIFIC CASE:" << std::endl;
  std::clog << "Insertion with NaN values does not ensure the filtration values are non decreasing" << std::endl;
  st.make_filtration_non_decreasing();

  std::clog << "Check all filtration values are NaN" << std::endl;
  for (auto f_simplex : st.complex_simplex_range()) {
    BOOST_CHECK(std::isnan(st.filtration(f_simplex)));
  }

  st.assign_filtration(st.find({0}), 0.);
  st.assign_filtration(st.find({1}), 0.);
  st.assign_filtration(st.find({2}), 0.);
  st.assign_filtration(st.find({3}), 0.);
  st.assign_filtration(st.find({4}), 0.);
  st.assign_filtration(st.find({5}), 0.);

  std::clog << "Check make_filtration_non_decreasing is modifying the simplicial complex" << std::endl;
  BOOST_CHECK(st.make_filtration_non_decreasing());
  
  std::clog << "Check all filtration values are now defined" << std::endl;
  for (auto f_simplex : st.complex_simplex_range()) {
    BOOST_CHECK(!std::isnan(st.filtration(f_simplex)));
  }
}